

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

int xmlXPathRegisterNs(xmlXPathContextPtr ctxt,xmlChar *prefix,xmlChar *ns_uri)

{
  int iVar1;
  xmlHashTablePtr pxVar2;
  xmlChar *payload;
  
  if (prefix == (xmlChar *)0x0 || ctxt == (xmlXPathContextPtr)0x0) {
    return -1;
  }
  if (*prefix == '\0') {
    return -1;
  }
  if (ctxt->nsHash == (xmlHashTablePtr)0x0) {
    pxVar2 = xmlHashCreate(10);
    ctxt->nsHash = pxVar2;
  }
  if (ctxt->nsHash != (xmlHashTablePtr)0x0) {
    if (ns_uri == (xmlChar *)0x0) {
      iVar1 = xmlHashRemoveEntry(ctxt->nsHash,prefix,xmlHashDefaultDeallocator);
      return iVar1;
    }
    payload = xmlStrdup(ns_uri);
    if (payload != (xmlChar *)0x0) {
      iVar1 = xmlHashUpdateEntry(ctxt->nsHash,prefix,payload,xmlHashDefaultDeallocator);
      if (iVar1 < 0) {
        xmlRaiseMemoryError(ctxt->error,(xmlGenericErrorFunc)0x0,ctxt->userData,0xc,&ctxt->lastError
                           );
        (*xmlFree)(payload);
        return -1;
      }
      return 0;
    }
  }
  xmlRaiseMemoryError(ctxt->error,(xmlGenericErrorFunc)0x0,ctxt->userData,0xc,&ctxt->lastError);
  return -1;
}

Assistant:

int
xmlXPathRegisterNs(xmlXPathContextPtr ctxt, const xmlChar *prefix,
			   const xmlChar *ns_uri) {
    xmlChar *copy;

    if (ctxt == NULL)
	return(-1);
    if (prefix == NULL)
	return(-1);
    if (prefix[0] == 0)
	return(-1);

    if (ctxt->nsHash == NULL)
	ctxt->nsHash = xmlHashCreate(10);
    if (ctxt->nsHash == NULL) {
        xmlXPathErrMemory(ctxt);
	return(-1);
    }
    if (ns_uri == NULL)
        return(xmlHashRemoveEntry(ctxt->nsHash, prefix,
	                          xmlHashDefaultDeallocator));

    copy = xmlStrdup(ns_uri);
    if (copy == NULL) {
        xmlXPathErrMemory(ctxt);
        return(-1);
    }
    if (xmlHashUpdateEntry(ctxt->nsHash, prefix, copy,
                           xmlHashDefaultDeallocator) < 0) {
        xmlXPathErrMemory(ctxt);
        xmlFree(copy);
        return(-1);
    }

    return(0);
}